

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O3

string * __thiscall
google::protobuf::io::SimpleDtoa_abi_cxx11_(string *__return_storage_ptr__,io *this,double value)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args_00;
  UntypedFormatSpecImpl format;
  UntypedFormatSpecImpl format_00;
  UntypedFormatSpecImpl format_01;
  char buffer [32];
  double parsed_value;
  char acStack_78 [40];
  double local_50;
  double local_48;
  Data local_40;
  code *local_38;
  double local_30;
  code *local_28;
  
  if (value < INFINITY) {
    if (-INFINITY < value) {
      if (!NAN(value)) {
        local_40 = (Data)0xf;
        local_38 = absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<int>;
        local_28 = absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<double>;
        args.len_ = 2;
        args.ptr_ = (pointer)&local_40;
        format_00.size_ = 4;
        format_00.data_ = "%.*g";
        local_50 = value;
        local_30 = value;
        iVar1 = absl::lts_20250127::str_format_internal::SnprintF(acStack_78,0x20,format_00,args);
        if (0xffffffe0 < iVar1 - 0x20U) {
          local_48 = NoLocaleStrtod(acStack_78,(char **)0x0);
          if ((local_48 != local_50) || (NAN(local_48) || NAN(local_50))) {
            local_40 = (Data)0x11;
            local_38 = absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<int>;
            local_28 = absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<double>;
            args_00.len_ = 2;
            args_00.ptr_ = (pointer)&local_40;
            format_01.size_ = 4;
            format_01.data_ = "%.*g";
            local_30 = value;
            iVar1 = absl::lts_20250127::str_format_internal::SnprintF
                              (acStack_78,0x20,format_01,args_00);
            if (iVar1 - 0x20U < 0xffffffe1) goto LAB_00454c42;
          }
          anon_unknown_0::DelocalizeRadix(acStack_78);
          goto LAB_00454b3a;
        }
        SimpleDtoa_abi_cxx11_((io *)local_40.buf);
LAB_00454c42:
        SimpleDtoa_abi_cxx11_((io *)local_40.buf);
      }
      pcVar4 = "nan";
      goto LAB_00454afe;
    }
    pcVar4 = "-inf";
    sVar3 = 4;
  }
  else {
    pcVar4 = "inf";
LAB_00454afe:
    sVar3 = 3;
  }
  format.size_ = sVar3;
  format.data_ = pcVar4;
  absl::lts_20250127::str_format_internal::SnprintF
            (acStack_78,0x20,format,
             (Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl>)ZEXT816(0));
LAB_00454b3a:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar2 = strlen(acStack_78);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_78,acStack_78 + sVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string SimpleDtoa(double value) {
  char buffer[kDoubleToBufferSize];
  return DoubleToBuffer(value, buffer);
}